

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

char * getShapeForTarget(cmGeneratorTarget *target)

{
  TargetType TVar1;
  cmGeneratorTarget *target_local;
  
  if (target == (cmGeneratorTarget *)0x0) {
    target_local = (cmGeneratorTarget *)anon_var_dwarf_8879b4;
  }
  else {
    TVar1 = cmGeneratorTarget::GetType(target);
    switch(TVar1) {
    case EXECUTABLE:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_8879be;
      break;
    case STATIC_LIBRARY:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_8879c8;
      break;
    case SHARED_LIBRARY:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_8879d2;
      break;
    case MODULE_LIBRARY:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_8879dc;
      break;
    default:
      target_local = (cmGeneratorTarget *)anon_var_dwarf_8879e6;
    }
  }
  return (char *)target_local;
}

Assistant:

static const char* getShapeForTarget(const cmGeneratorTarget* target)
{
  if (!target) {
    return "ellipse";
  }

  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      return "house";
    case cmStateEnums::STATIC_LIBRARY:
      return "diamond";
    case cmStateEnums::SHARED_LIBRARY:
      return "polygon";
    case cmStateEnums::MODULE_LIBRARY:
      return "octagon";
    default:
      break;
  }

  return "box";
}